

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IceContainer.cpp
# Opt level: O3

bool __thiscall IceCore::Container::SetSize(Container *this,udword nb)

{
  udword *puVar1;
  
  Empty(this);
  if (nb != 0) {
    this->mMaxNbEntries = nb;
    puVar1 = (udword *)operator_new__((ulong)nb << 2);
    this->mEntries = puVar1;
    mUsedRam = mUsedRam + nb * 4;
  }
  return nb != 0;
}

Assistant:

bool Container::SetSize(udword nb)
{
	// Make sure it's empty
	Empty();

	// Checkings
	if(!nb)	return false;

	// Initialize for nb entries
	mMaxNbEntries = nb;

	// Get some bytes for new entries
	mEntries = new udword[mMaxNbEntries];
	CHECKALLOC(mEntries);

#ifdef CONTAINER_STATS
	// Add current amount of bytes
	mUsedRam+=mMaxNbEntries*sizeof(udword);
#endif
	return true;
}